

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateTopHeaderGuard
          (FileGenerator *this,Printer *printer,bool pb_h)

{
  bool bVar1;
  Printer *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000030;
  Formatter format;
  Formatter *in_stack_ffffffffffffff80;
  vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
  *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffffb8;
  Formatter *in_stack_ffffffffffffffc0;
  
  Formatter::Formatter
            (in_stack_ffffffffffffff80,in_RDI,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x4d297e);
  IncludeGuard_abi_cxx11_
            ((FileDescriptor *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,
             (bool)format.vars_._M_t._M_impl._7_1_,(Options *)format.printer_);
  Formatter::operator()
            ((Formatter *)CONCAT17(format.vars_._M_t._M_impl._7_1_,format.vars_._M_t._M_impl._0_7_),
             &(format.printer_)->variable_delimiter_,in_stack_00000030);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  if (((in_RDI->substitutions_)._M_t._M_impl.super__Rb_tree_header._M_node_count & 0x100000000) == 0
     ) {
    bVar1 = std::
            vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
            ::empty(in_stack_ffffffffffffff90);
    if (!bVar1) {
      Formatter::operator()<>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
  }
  Formatter::operator()<>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  Formatter::~Formatter((Formatter *)0x4d2a3a);
  return;
}

Assistant:

void FileGenerator::GenerateTopHeaderGuard(io::Printer* printer, bool pb_h) {
  Formatter format(printer, variables_);
  // Generate top of header.
  format(
      "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
      "// source: $filename$\n"
      "\n"
      "#ifndef $1$\n"
      "#define $1$\n"
      "\n"
      "#include <limits>\n"
      "#include <string>\n",
      IncludeGuard(file_, pb_h, options_));
  if (!options_.opensource_runtime && !enum_generators_.empty()) {
    // Add header to provide std::is_integral for safe Enum_Name() function.
    format("#include <type_traits>\n");
  }
  format("\n");
}